

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

void __thiscall phosg::cannot_stat_file::cannot_stat_file(cannot_stat_file *this,string *filename)

{
  uint *puVar1;
  int error;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::operator+(&local_30,"can\'t stat file ",filename);
  ::std::operator+(&local_70,&local_30,": ");
  puVar1 = (uint *)__errno_location();
  string_for_error_abi_cxx11_(&local_90,(phosg *)(ulong)*puVar1,error);
  ::std::operator+(&local_50,&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
  ::std::runtime_error::runtime_error((runtime_error *)&this->field_0x10,(string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_30);
  this->_vptr_cannot_stat_file = (_func_int **)0x120ae0;
  *(undefined8 *)&this->field_0x10 = 0x120b10;
  this->error = *puVar1;
  return;
}

Assistant:

cannot_stat_file::cannot_stat_file(const string& filename)
    : runtime_error("can\'t stat file " + filename + ": " + string_for_error(errno)),
      error(errno) {}